

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
ChebTools::ChebyshevExpansion::real_roots2
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ChebyshevExpansion *this,
          bool only_in_domain)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  DenseStorage<double,__1,__1,_1,_0> *other;
  double *pdVar7;
  char *__function;
  ulong uVar8;
  iterator iVar9;
  double *pdVar10;
  int iVar11;
  ulong uVar12;
  Scalar SVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double *extraout_XMM0_Qb;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  VectorXd yy;
  VectorXd xscaled;
  anon_class_64_1_54a39805 secant;
  double local_148;
  double local_138;
  double local_120;
  double local_118;
  double *pdStack_110;
  undefined1 local_108 [16];
  double local_f8;
  vector<double,_std::allocator<double>_> *local_f0;
  ChebyshevExpansion *local_e8;
  undefined1 local_e0 [56];
  ChebyshevExpansion local_a8;
  double local_68;
  double *pdStack_60;
  DenseStorage<double,__1,__1,_1,_0> *local_50;
  DenseStorage<double,__1,__1,_1,_0> *local_48;
  double *local_40;
  long local_38;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  local_f0 = __return_storage_ptr__;
  other = (DenseStorage<double,__1,__1,_1,_0> *)
          ChebyshevLobattoNodesLibrary::get
                    ((ChebyshevLobattoNodesLibrary *)CLnodes_library,lVar3 * 2 - 2);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)(local_e0 + 0x28),other);
  y_Clenshaw_xscaled((ChebyshevExpansion *)local_e0,&this->m_c);
  if ((long)local_e0._8_8_ < 1) {
    __function = 
    "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::redux(const Func &) const [Derived = Eigen::Matrix<double, -1, 1>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
    ;
  }
  else {
    local_a8.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)local_e0._0_8_;
    local_e0._16_8_ =
         Eigen::internal::
         redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
         ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                   ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_e0 + 0x38),
                    (scalar_max_op<double,_double,_0> *)&local_120,
                    (Matrix<double,__1,_1,_0,__1,_1> *)local_e0);
    if (0 < (long)local_e0._8_8_) {
      local_a8.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)local_e0._0_8_;
      SVar13 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_min_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
               ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                         ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          (local_e0 + 0x38),(scalar_min_op<double,_double,_0> *)&local_120,
                          (Matrix<double,__1,_1,_0,__1,_1> *)local_e0);
      local_38 = lVar3 * 2 + -1;
      if (2 < local_38) {
        local_e0._16_8_ = ((double)local_e0._16_8_ - SVar13) * 1e-14;
        local_40 = &this->m_xmin;
        local_48 = (DenseStorage<double,__1,__1,_1,_0> *)&this->m_recurrence_buffer;
        local_50 = (DenseStorage<double,__1,__1,_1,_0> *)&this->m_nodal_value_cache;
        pdVar10 = (double *)0x2;
        uVar8 = 0;
        local_e8 = this;
        do {
          uVar6 = local_e0._40_8_;
          uVar5 = local_e0._0_8_;
          if ((((((long)local_e0._48_8_ <= (long)uVar8) || ((long)local_e0._8_8_ <= (long)uVar8)) ||
               (pdVar7 = (double *)(uVar8 | 1), (ulong)local_e0._48_8_ <= pdVar7)) ||
              (((ulong)local_e0._8_8_ <= pdVar7 || ((ulong)local_e0._48_8_ <= pdVar10)))) ||
             ((ulong)local_e0._8_8_ <= pdVar10)) {
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x19a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          pdVar1 = (double *)(local_e0._40_8_ + uVar8 * 8);
          dVar16 = *pdVar1;
          dVar15 = pdVar1[1];
          dVar14 = *(double *)(local_e0._0_8_ + uVar8 * 8);
          if ((double)local_e0._16_8_ <= ABS(dVar14)) {
            dVar21 = *(double *)(local_e0._40_8_ + (long)pdVar10 * 8);
            dVar24 = dVar15 - dVar16;
            dVar22 = dVar21 - dVar16;
            dVar23 = dVar21 - dVar15;
            dVar19 = dVar23 * dVar24 * dVar22;
            dVar20 = *(double *)(local_e0._0_8_ + pdVar7 * 8);
            dVar2 = *(double *)(local_e0._0_8_ + pdVar10 * 8);
            dVar25 = (dVar24 * dVar2 + (dVar23 * dVar14 - dVar20 * dVar22)) / dVar19;
            auVar26._0_8_ =
                 dVar2 * dVar15 * dVar24 * dVar16 +
                 dVar14 * dVar15 * dVar23 * dVar21 + dVar20 * dVar21 * -dVar22 * dVar16;
            auVar26._8_8_ =
                 dVar2 * -(dVar15 * dVar15 - dVar16 * dVar16) +
                 dVar14 * -(dVar21 * dVar21 - dVar15 * dVar15) +
                 dVar20 * (dVar21 * dVar21 - dVar16 * dVar16);
            auVar27._8_8_ = dVar19;
            auVar27._0_8_ = dVar19;
            auVar27 = divpd(auVar26,auVar27);
            dVar16 = auVar27._8_8_;
            dVar14 = dVar16 * dVar16 + dVar25 * -4.0 * auVar27._0_8_;
            if (0.0 <= dVar14) {
              if ((dVar25 != 0.0) || (NAN(dVar25))) {
                if ((dVar14 == 0.0) && (!NAN(dVar14))) {
                  dVar14 = -dVar16 / (dVar25 + dVar25);
                  goto LAB_0010702e;
                }
                if (dVar14 < 0.0) {
                  local_108 = auVar27;
                  dVar14 = sqrt(dVar14);
                  auVar27 = local_108;
                }
                else {
                  dVar14 = SQRT(dVar14);
                }
                dVar15 = auVar27._0_8_;
                if (0.0 <= dVar16) {
                  auVar18._0_8_ = -dVar16 - dVar14;
                  auVar18._8_8_ = dVar15 + dVar15;
                  auVar4._8_8_ = auVar18._0_8_;
                  auVar4._0_8_ = dVar25 + dVar25;
                  auVar29 = divpd(auVar18,auVar4);
                }
                else {
                  dVar14 = dVar14 - auVar27._8_8_;
                  auVar28._0_8_ = dVar15 + dVar15;
                  auVar28._8_8_ = dVar14;
                  auVar17._8_8_ = dVar25 + dVar25;
                  auVar17._0_8_ = dVar14;
                  auVar29 = divpd(auVar28,auVar17);
                }
              }
              else {
                dVar14 = -auVar27._0_8_ / dVar16;
LAB_0010702e:
                auVar29._8_8_ = 0xc08f400000000000;
                auVar29._0_8_ = dVar14;
              }
              dVar14 = *(double *)(uVar6 + uVar8 * 8);
              dVar15 = *(double *)(uVar6 + (long)pdVar10 * 8);
              dVar21 = dVar15;
              if (dVar14 <= dVar15) {
                dVar21 = dVar14;
              }
              dVar20 = auVar29._0_8_;
              if (dVar15 <= dVar14) {
                dVar15 = dVar14;
              }
              dVar14 = auVar29._8_8_;
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                        ((DenseStorage<double,__1,__1,_1,_0> *)(local_e0 + 0x38),
                         (DenseStorage<double,__1,__1,_1,_0> *)local_e8);
              local_a8.m_xmin = *local_40;
              local_a8.m_xmax = local_40[1];
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                        ((DenseStorage<double,__1,__1,_1,_0> *)&local_a8.m_recurrence_buffer,
                         local_48);
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                        ((DenseStorage<double,__1,__1,_1,_0> *)&local_a8.m_nodal_value_cache,
                         local_50);
              this = local_e8;
              __return_storage_ptr__ = local_f0;
              if ((dVar21 < dVar20 && dVar20 < dVar15) && (dVar21 < dVar14 && dVar14 < dVar15)) {
                local_148 = -dVar16 / (dVar25 + dVar25);
                local_68 = y_Clenshaw_xscaled(local_e8,local_148);
                dVar14 = *(double *)(uVar6 + uVar8 * 8);
                local_118 = *(double *)(uVar5 + uVar8 * 8);
                pdStack_110 = (double *)0x0;
                local_108._0_8_ =
                     local_148 - ((local_148 - dVar14) * local_68) / (local_68 - local_118);
                pdStack_60 = extraout_XMM0_Qb;
                local_108._8_8_ = -dVar16;
                dVar15 = y_Clenshaw_xscaled((ChebyshevExpansion *)(local_e0 + 0x38),
                                            (double)local_108._0_8_);
                __return_storage_ptr__ = local_f0;
                iVar11 = 0x32;
                local_f8 = local_68;
                pdVar7 = pdStack_110;
                dVar16 = local_148;
                do {
                  dVar20 = dVar15 * local_118;
                  dVar21 = (double)local_108._0_8_;
                  if (dVar20 <= 0.0) {
                    dVar21 = dVar14;
                  }
                  if (ABS(dVar15) < 1e-14) break;
                  uVar12 = -(ulong)(0.0 < dVar20);
                  dVar16 = (double)(~uVar12 & local_108._0_8_ | (ulong)dVar16 & uVar12);
                  if (ABS(dVar16 - dVar21) < 1e-14) break;
                  if (dVar20 <= 0.0) {
                    local_f8 = dVar15;
                  }
                  local_e0._24_8_ = ~uVar12 & (ulong)local_118 | (ulong)dVar15 & uVar12;
                  local_108._0_8_ =
                       dVar16 - ((dVar16 - dVar21) * local_f8) /
                                (local_f8 - (double)local_e0._24_8_);
                  local_118 = dVar21;
                  local_e0._32_8_ = pdVar7;
                  dVar15 = y_Clenshaw_xscaled((ChebyshevExpansion *)(local_e0 + 0x38),
                                              (double)local_108._0_8_);
                  iVar11 = iVar11 + -1;
                  dVar14 = local_118;
                  local_118 = (double)local_e0._24_8_;
                  pdVar7 = (double *)local_e0._32_8_;
                } while (iVar11 != 0);
                local_138 = *(double *)(uVar6 + (long)pdVar10 * 8);
                local_f8 = *(double *)(uVar5 + pdVar10 * 8);
                local_118 = local_138 - ((local_138 - local_148) * local_f8) / (local_f8 - local_68)
                ;
                pdStack_110 = (double *)0x0;
                dVar16 = y_Clenshaw_xscaled((ChebyshevExpansion *)(local_e0 + 0x38),local_118);
                this = local_e8;
                iVar11 = 0x32;
                dVar14 = local_68;
                do {
                  dVar21 = dVar16 * dVar14;
                  dVar15 = local_118;
                  if (dVar21 <= 0.0) {
                    dVar15 = local_148;
                  }
                  if (ABS(dVar16) < 1e-14) break;
                  uVar12 = -(ulong)(0.0 < dVar21);
                  local_138 = (double)(~uVar12 & (ulong)local_118 | (ulong)local_138 & uVar12);
                  if (ABS(local_138 - dVar15) < 1e-14) break;
                  if (dVar21 <= 0.0) {
                    local_f8 = dVar16;
                  }
                  local_e0._24_8_ = ~uVar12 & (ulong)dVar14 | (ulong)dVar16 & uVar12;
                  local_118 = local_138 -
                              ((local_138 - dVar15) * local_f8) /
                              (local_f8 - (double)local_e0._24_8_);
                  local_e0._32_8_ = pdStack_60;
                  dVar16 = y_Clenshaw_xscaled((ChebyshevExpansion *)(local_e0 + 0x38),local_118);
                  iVar11 = iVar11 + -1;
                  dVar14 = (double)local_e0._24_8_;
                  pdStack_60 = (double *)local_e0._32_8_;
                  local_148 = dVar15;
                } while (iVar11 != 0);
                local_120 = (this->m_xmax + this->m_xmin +
                            (this->m_xmax - this->m_xmin) * (double)local_108._0_8_) * 0.5;
                iVar9._M_current =
                     (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                pdVar7 = (__return_storage_ptr__->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                if (iVar9._M_current == pdVar7) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (__return_storage_ptr__,iVar9,&local_120);
                  iVar9._M_current =
                       (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
                  pdVar7 = (__return_storage_ptr__->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
                }
                else {
                  *iVar9._M_current = local_120;
                  iVar9._M_current = iVar9._M_current + 1;
                  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current;
                }
                local_120 = (this->m_xmax + this->m_xmin + (this->m_xmax - this->m_xmin) * local_118
                            ) * 0.5;
                if (iVar9._M_current == pdVar7) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (__return_storage_ptr__,iVar9,&local_120);
                }
                else {
LAB_001076b9:
                  *iVar9._M_current = local_120;
                  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_finish = iVar9._M_current + 1;
                }
              }
              else if ((dVar21 < dVar20 && dVar20 < dVar15) != (dVar21 < dVar14 && dVar14 < dVar15))
              {
                local_118 = *(double *)(uVar6 + uVar8 * 8);
                local_148 = *(double *)(uVar5 + uVar8 * 8);
                local_138 = *(double *)(uVar6 + (long)pdVar10 * 8);
                local_e0._24_8_ = *(double *)(uVar5 + pdVar10 * 8);
                local_108._0_8_ =
                     local_138 -
                     ((local_138 - local_118) * (double)local_e0._24_8_) /
                     ((double)local_e0._24_8_ - local_148);
                local_108._8_8_ = 0;
                dVar14 = y_Clenshaw_xscaled((ChebyshevExpansion *)(local_e0 + 0x38),
                                            (double)local_108._0_8_);
                iVar11 = 0x32;
                do {
                  dVar15 = dVar14 * local_148;
                  dVar16 = (double)local_108._0_8_;
                  if (dVar15 <= 0.0) {
                    dVar16 = local_118;
                  }
                  dVar21 = (double)local_108._0_8_;
                  if (ABS(dVar14) < 1e-14) break;
                  uVar12 = -(ulong)(0.0 < dVar15);
                  local_138 = (double)(~uVar12 & local_108._0_8_ | (ulong)local_138 & uVar12);
                  if (ABS(local_138 - dVar16) < 1e-14) break;
                  if (dVar15 <= 0.0) {
                    local_e0._24_8_ = dVar14;
                  }
                  local_148 = (double)(~uVar12 & (ulong)local_148 | (ulong)dVar14 & uVar12);
                  local_108._0_8_ =
                       local_138 -
                       ((local_138 - dVar16) * (double)local_e0._24_8_) /
                       ((double)local_e0._24_8_ - local_148);
                  local_118 = dVar16;
                  dVar14 = y_Clenshaw_xscaled((ChebyshevExpansion *)(local_e0 + 0x38),
                                              (double)local_108._0_8_);
                  iVar11 = iVar11 + -1;
                  dVar21 = (double)local_108._0_8_;
                } while (iVar11 != 0);
                local_120 = (this->m_xmax + this->m_xmin + (this->m_xmax - this->m_xmin) * dVar21) *
                            0.5;
                iVar9._M_current =
                     (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar9._M_current !=
                    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001076b9;
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (__return_storage_ptr__,iVar9,&local_120);
              }
              free(local_a8.m_nodal_value_cache.
                   super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
              free(local_a8.m_recurrence_buffer.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
              free(local_a8.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data);
            }
          }
          else {
            local_a8.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data = (double *)
                     (((this->m_xmax - this->m_xmin) * dVar16 + this->m_xmax + this->m_xmin) * 0.5);
            iVar9._M_current =
                 (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar9._M_current ==
                (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        (__return_storage_ptr__,iVar9,(double *)(local_e0 + 0x38));
            }
            else {
              *iVar9._M_current =
                   (double)local_a8.m_c.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_data;
              (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar9._M_current + 1;
            }
          }
          pdVar10 = (double *)((long)pdVar10 + 2);
          uVar8 = uVar8 + 2;
        } while ((long)pdVar10 < local_38);
      }
      free((void *)local_e0._0_8_);
      free((void *)local_e0._40_8_);
      return __return_storage_ptr__;
    }
    __function = 
    "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::redux(const Func &) const [Derived = Eigen::Matrix<double, -1, 1>, BinaryOp = Eigen::internal::scalar_min_op<double>]"
    ;
  }
  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                ,0x19b,__function);
}

Assistant:

std::vector<double> ChebyshevExpansion::real_roots2(bool only_in_domain) const {
        //vector of roots to be returned
        std::vector<double> roots;

        auto N = m_c.size()-1;
        auto Ndegree_scaled = N*2;
        Eigen::VectorXd xscaled = get_CLnodes(Ndegree_scaled), yy = y_Clenshaw_xscaled(xscaled);
        double ytol = 1e-14*(yy.maxCoeff()-yy.minCoeff());
        
        // a,b,c can also be obtained by solving the matrix system:
        // [x_k^2, x_k, 1] = [b_k] for k in 1,2,3
        for (auto i = 0; i+2 < Ndegree_scaled+1; i += 2){
            const double &x_1 = xscaled[i + 0], &y_1 = yy[i + 0],
                         &x_2 = xscaled[i + 1], &y_2 = yy[i + 1],
                         &x_3 = xscaled[i + 2], &y_3 = yy[i + 2];
            double d = (x_3 - x_2)*(x_2 - x_1)*(x_3 - x_1);
            double a = ((x_3 - x_2)*y_1 - (x_3 - x_1)*y_2 + (x_2 - x_1)*y_3) / d;
            double b = (-(POW2(x_3) - POW2(x_2))*y_1 + (POW2(x_3) - POW2(x_1))*y_2 - (POW2(x_2) - POW2(x_1))*y_3) / d;
            double c = ((x_3 - x_2)*x_2*x_3*y_1 - (x_3 - x_1)*x_1*x_3*y_2 + (x_2 - x_1)*x_2*x_1*y_3) / d;

            // Check if precisely at a nodal value
            if (std::abs(y_1) < ytol) {
                roots.push_back(((m_xmax - m_xmin) * x_1 + (m_xmax + m_xmin)) / 2.0);
                continue;
            }

            // Discriminant of quadratic
            double D = b*b - 4*a*c;
            if (D >= 0) {
                double root1, root2;
                if (a == 0){
                    // Linear
                    root1 = -c/b;
                    root2 = -1000; // Something outside the domain; we are in scaled coordinates so this will definitely get rejected
                }
                else if (D == 0) { // Unlikely due to numerical precision
                    // Two equal real roots
                    root1 = -b/(2*a);
                    root2 = -1000; // Something outside the domain; we are in scaled coordinates so this will definitely get rejected
                }
                else {
                    // Numerically stable method for solving quadratic
                    // From https://people.csail.mit.edu/bkph/articles/Quadratics.pdf
                    double sqrtD = sqrt(D);
                    if (b >= 0){
                        root1 = (-b - sqrtD)/(2*a);
                        root2 = 2*c/(-b-sqrtD);
                    }
                    else {
                        root1 = 2*c/(-b+sqrtD);
                        root2 = (-b+sqrtD)/(2*a);
                    }
                }
                bool in1 = inbetween(x_1, x_3, root1), in2 = inbetween(x_1, x_3, root2);
                const ChebyshevExpansion &e = *this;
                auto secant = [e](double a, double ya, double b, double yb, double yeps = 1e-14, double xeps = 1e-14) {
                    auto c = b - yb*(b - a) / (yb - ya);
                    auto yc = e.y_Clenshaw_xscaled(c);
                    for (auto i = 0; i < 50; ++i){
                        if (yc*ya > 0) {
                            a=c; ya=yc;
                        }
                        else {
                            b=c; yb=yc;
                        }
                        if (std::abs(b - a) < xeps) { break; }
                        if (std::abs(yc) < yeps){ break; }
                        c = b - yb*(b - a) / (yb - ya);
                        yc = e.y_Clenshaw_xscaled(c);
                    }
                    return c;
                };
                int Nroots_inside = static_cast<int>(in1) + static_cast<int>(in2);
                if (Nroots_inside == 2) {
                    // Split the domain at the midline of the quadratic, polish each root against the underlying expansion
                    double x_m = -b/(2*a), y_m = e.y_Clenshaw_xscaled(x_m);
                    root1 = secant(x_1, y_1, x_m, y_m);
                    root2 = secant(x_m, y_m, x_3, y_3);
                    // Rescale back into real-world values in [xmin,xmax] from [-1,1]
                    roots.push_back(((m_xmax - m_xmin)*root1 + (m_xmax + m_xmin)) / 2.0); 
                    roots.push_back(((m_xmax - m_xmin)*root2 + (m_xmax + m_xmin)) / 2.0);
                }
                else if(Nroots_inside == 1) {
                    root1 = secant(x_1, y_1, x_3, y_3);
                    roots.push_back(((m_xmax - m_xmin)*root1 + (m_xmax + m_xmin)) / 2.0);
                }
                else {}
            }
        }
        return roots;
    }